

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxharrisrt.hpp
# Opt level: O2

int __thiscall
soplex::SPxHarrisRT<double>::selectLeave
          (SPxHarrisRT<double> *this,double *val,double param_2,bool param_3)

{
  double dVar1;
  long lVar2;
  long *plVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar6;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  ulong *puVar7;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined7 in_register_00000011;
  uint uVar8;
  long lVar9;
  undefined4 uVar10;
  uint uVar12;
  double dVar11;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  ulong uVar13;
  double dVar14;
  int local_dc;
  double local_d8;
  double max;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  double *local_a0;
  double maxabs;
  long local_90;
  double local_88;
  ulong uStack_80;
  SSVectorBase<double> *local_70;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  double local_48;
  ulong uStack_40;
  double local_38;
  undefined4 extraout_var_02;
  
  maxabs = 1.0;
  iVar4 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])
                    (SUB84(param_2,0),this,val,CONCAT71(in_register_00000011,param_3));
  dVar11 = SPxSolverBase<double>::epsilon((SPxSolverBase<double> *)CONCAT44(extraout_var,iVar4));
  local_b8._8_4_ = extraout_XMM0_Dc;
  local_b8._0_8_ = dVar11;
  local_b8._12_4_ = extraout_XMM0_Dd;
  dVar11 = degenerateEps(this);
  local_68._8_4_ = extraout_XMM0_Dc_00;
  local_68._0_8_ = dVar11;
  local_68._12_4_ = extraout_XMM0_Dd_00;
  iVar4 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  lVar2 = *(long *)(CONCAT44(extraout_var_00,iVar4) + 0x6a8);
  local_70 = (SSVectorBase<double> *)(lVar2 + 0x20);
  iVar4 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  plVar3 = *(long **)(CONCAT44(extraout_var_01,iVar4) + 0x6a8);
  iVar4 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  lVar6 = CONCAT44(extraout_var_02,iVar4);
  iVar4 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  lVar9 = CONCAT44(extraout_var_03,iVar4);
  max = *val;
  local_88 = max;
  iVar4 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  local_38 = (double)(**(code **)(*(long *)CONCAT44(extraout_var_04,iVar4) + 0x368))
                               ((long *)CONCAT44(extraout_var_04,iVar4));
  iVar4 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  SSVectorBase<double>::setup
            ((SSVectorBase<double> *)(*(long *)(CONCAT44(extraout_var_05,iVar4) + 0x6a8) + 0x20));
  local_a0 = val;
  local_90 = lVar9;
  if (local_88 <= (double)local_b8._0_8_) {
    if (-(double)local_b8._0_8_ <= local_88) {
      return -1;
    }
    minDelta(this,&maxabs,&max,*(int *)(lVar2 + 0x28),*(int **)(lVar2 + 0x30),
             *(double **)(lVar2 + 0x40),(double *)*plVar3,*(double **)(lVar9 + 0x688),
             *(double **)(lVar6 + 0x670));
    if ((max == *local_a0) && (!NAN(max) && !NAN(*local_a0))) {
      return -1;
    }
    puVar7 = (ulong *)infinity();
    local_c8._8_8_ = 0;
    local_c8._0_8_ = *puVar7;
    dVar11 = maxabs * (double)local_b8._0_8_ * 0.001;
    local_48 = (double)local_b8._0_8_;
    if ((double)local_b8._0_8_ <= dVar11) {
      local_48 = dVar11;
    }
    uVar8 = *(uint *)(lVar2 + 0x28);
    uStack_40 = local_b8._8_8_;
    local_88 = -local_48;
    uStack_80 = local_b8._8_8_ ^ 0x8000000000000000;
    local_58._8_4_ = local_68._8_4_;
    local_58._0_8_ = local_68._0_8_ ^ 0x8000000000000000;
    local_58._12_4_ = local_68._12_4_ ^ 0x80000000;
    local_d8 = 0.0;
    dVar11 = (double)local_b8._0_8_;
    local_dc = -1;
    while (0 < (int)uVar8) {
      uVar8 = uVar8 - 1;
      iVar4 = *(int *)(*(long *)(lVar2 + 0x30) + (ulong)uVar8 * 4);
      lVar9 = (long)iVar4;
      dVar1 = *(double *)(*(long *)(lVar2 + 0x40) + lVar9 * 8);
      uVar10 = SUB84(dVar1,0);
      uVar12 = (uint)((ulong)dVar1 >> 0x20);
      if (local_88 <= dVar1) {
        if (dVar1 <= local_48) {
          SSVectorBase<double>::clearNum(local_70,uVar8);
          dVar11 = (double)local_b8._0_8_;
        }
        else {
          dVar14 = *(double *)(*(long *)(local_90 + 0x688) + lVar9 * 8) -
                   *(double *)(*plVar3 + lVar9 * 8);
          if (dVar14 <= (double)local_68._0_8_) {
            dVar14 = dVar14 / dVar1;
            if ((max <= dVar14) && (dVar14 < dVar11 + (double)local_c8._0_8_)) goto LAB_002038e1;
          }
          else {
            iVar5 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
            SPxSolverBase<double>::shiftLBbound
                      ((SPxSolverBase<double> *)CONCAT44(extraout_var_07,iVar5),iVar4,
                       *(double *)(*plVar3 + lVar9 * 8));
            dVar11 = (double)local_b8._0_8_;
          }
        }
      }
      else {
        dVar14 = *(double *)(*(long *)(lVar6 + 0x670) + lVar9 * 8) -
                 *(double *)(*plVar3 + lVar9 * 8);
        if ((double)local_58._0_8_ <= dVar14) {
          dVar14 = dVar14 / dVar1;
          if ((max <= dVar14) && (dVar14 < dVar11 + (double)local_c8._0_8_)) {
            uVar12 = uVar12 ^ 0x80000000;
LAB_002038e1:
            if (local_d8 <= (double)CONCAT44(uVar12,uVar10) &&
                (double)CONCAT44(uVar12,uVar10) != local_d8) {
              local_c8._8_8_ = 0;
              local_c8._0_8_ = dVar14;
              local_d8 = (double)CONCAT44(uVar12,uVar10);
              local_dc = iVar4;
            }
          }
        }
        else {
          iVar5 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
          SPxSolverBase<double>::shiftUBbound
                    ((SPxSolverBase<double> *)CONCAT44(extraout_var_06,iVar5),iVar4,
                     *(double *)(*plVar3 + lVar9 * 8));
          dVar11 = (double)local_b8._0_8_;
        }
      }
    }
  }
  else {
    maxDelta(this,&maxabs,&max,*(int *)(lVar2 + 0x28),*(int **)(lVar2 + 0x30),
             *(double **)(lVar2 + 0x40),(double *)*plVar3,*(double **)(lVar9 + 0x688),
             *(double **)(lVar6 + 0x670));
    if ((max == *local_a0) && (!NAN(max) && !NAN(*local_a0))) {
      return -1;
    }
    puVar7 = (ulong *)infinity();
    uVar13 = (ulong)DAT_002ce2e0;
    local_c8._8_4_ = DAT_002ce2e0._8_4_;
    local_c8._0_8_ = *puVar7 ^ uVar13;
    local_c8._12_4_ = DAT_002ce2e0._12_4_;
    dVar11 = maxabs * (double)local_b8._0_8_ * 0.001;
    local_88 = (double)local_b8._0_8_;
    if ((double)local_b8._0_8_ <= dVar11) {
      local_88 = dVar11;
    }
    uVar8 = *(uint *)(lVar2 + 0x28);
    uStack_80 = local_b8._8_8_;
    local_58._8_8_ = local_b8._8_8_ ^ DAT_002ce2e0._8_8_;
    local_58._0_8_ = (ulong)local_88 ^ uVar13;
    local_48 = (double)(uVar13 ^ local_68._0_8_);
    uStack_40 = DAT_002ce2e0._8_8_ ^ local_68._8_8_;
    local_d8 = 0.0;
    dVar11 = (double)local_b8._0_8_;
    local_dc = -1;
    while (0 < (int)uVar8) {
      uVar8 = uVar8 - 1;
      iVar4 = *(int *)(*(long *)(lVar2 + 0x30) + (ulong)uVar8 * 4);
      lVar9 = (long)iVar4;
      dVar1 = *(double *)(*(long *)(lVar2 + 0x40) + lVar9 * 8);
      uVar10 = SUB84(dVar1,0);
      uVar12 = (uint)((ulong)dVar1 >> 0x20);
      if (dVar1 <= local_88) {
        if ((double)local_58._0_8_ <= dVar1) {
          SSVectorBase<double>::clearNum(local_70,uVar8);
          dVar11 = (double)local_b8._0_8_;
        }
        else {
          dVar14 = *(double *)(*(long *)(local_90 + 0x688) + lVar9 * 8) -
                   *(double *)(*plVar3 + lVar9 * 8);
          if (dVar14 <= (double)local_68._0_8_) {
            dVar14 = dVar14 / dVar1;
            if ((dVar14 <= max) && ((double)local_c8._0_8_ - dVar11 < dVar14)) {
              uVar12 = uVar12 ^ 0x80000000;
              goto LAB_00203ac8;
            }
          }
          else {
            iVar5 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
            SPxSolverBase<double>::shiftLBbound
                      ((SPxSolverBase<double> *)CONCAT44(extraout_var_09,iVar5),iVar4,
                       *(double *)(*plVar3 + lVar9 * 8));
            dVar11 = (double)local_b8._0_8_;
          }
        }
      }
      else {
        dVar14 = *(double *)(*(long *)(lVar6 + 0x670) + lVar9 * 8) -
                 *(double *)(*plVar3 + lVar9 * 8);
        if (local_48 <= dVar14) {
          dVar14 = dVar14 / dVar1;
          if ((dVar14 <= max) && ((double)local_c8._0_8_ - dVar11 < dVar14)) {
LAB_00203ac8:
            if (local_d8 <= (double)CONCAT44(uVar12,uVar10) &&
                (double)CONCAT44(uVar12,uVar10) != local_d8) {
              local_c8._8_8_ = 0;
              local_c8._0_8_ = dVar14;
              local_d8 = (double)CONCAT44(uVar12,uVar10);
              local_dc = iVar4;
            }
          }
        }
        else {
          iVar5 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
          SPxSolverBase<double>::shiftUBbound
                    ((SPxSolverBase<double> *)CONCAT44(extraout_var_08,iVar5),iVar4,
                     *(double *)(*plVar3 + lVar9 * 8));
          dVar11 = (double)local_b8._0_8_;
        }
      }
    }
  }
  iVar4 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  dVar11 = (double)(**(code **)(*(long *)CONCAT44(extraout_var_10,iVar4) + 0x368))
                             ((long *)CONCAT44(extraout_var_10,iVar4));
  if ((local_38 != dVar11) || (NAN(local_38) || NAN(dVar11))) {
    local_dc = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[7])(0,this,local_a0,0);
  }
  else {
    *local_a0 = (double)local_c8._0_8_;
  }
  return local_dc;
}

Assistant:

int SPxHarrisRT<R>::selectLeave(R& val, R, bool)
{
   int i, j;
   R stab, x, y;
   R max;
   R sel;
   R lastshift;
   R useeps;
   int leave = -1;
   R maxabs = 1;

   R epsilon  = this->solver()->epsilon();
   R degeneps = degenerateEps();

   SSVectorBase<R>& upd = this->solver()->fVec().delta();
   VectorBase<R>& vec = this->solver()->fVec();

   const VectorBase<R>& up = this->solver()->ubBound();
   const VectorBase<R>& low = this->solver()->lbBound();

   assert(this->delta > epsilon);
   assert(epsilon > 0);
   assert(this->solver()->maxCycle() > 0);

   max = val;
   lastshift = this->solver()->shift();

   this->solver()->fVec().delta().setup();

   if(max > epsilon)
   {
      // phase 1:
      maxDelta(
         &maxabs,             /* max abs value in upd */
         &max,                /* initial and chosen value */
         upd.size(),          /* # of indices in upd */
         upd.indexMem(),      /* nonzero indices in upd */
         upd.values(),        /* update VectorBase<R> for vec */
         vec.get_const_ptr(),         /* current VectorBase<R> */
         low.get_const_ptr(),                 /* lower bounds for vec */
         up.get_const_ptr()                   /* upper bounds for vec */
      );

      if(max == val)
         return -1;


      // phase 2:
      stab = 0;
      sel = R(-infinity);
      useeps = maxabs * epsilon * 0.001;

      if(useeps < epsilon)
         useeps = epsilon;

      for(j = upd.size() - 1; j >= 0; --j)
      {
         i = upd.index(j);
         x = upd[i];

         if(x > useeps)
         {
            y = up[i] - vec[i];

            if(y < -degeneps)
               this->solver()->shiftUBbound(i, vec[i]); // ensure simplex improvement
            else
            {
               y /= x;

               if(y <= max && y > sel - epsilon && x > stab)
               {
                  sel = y;
                  leave = i;
                  stab = x;
               }
            }
         }
         else if(x < -useeps)
         {
            y = low[i] - vec[i];

            if(y > degeneps)
               this->solver()->shiftLBbound(i, vec[i]); // ensure simplex improvement
            else
            {
               y /= x;

               if(y <= max && y > sel - epsilon && -x > stab)
               {
                  sel = y;
                  leave = i;
                  stab = -x;
               }
            }
         }
         else
            upd.clearNum(j);
      }
   }


   else if(max < -epsilon)
   {
      // phase 1:
      minDelta(
         &maxabs,             /* max abs value in upd */
         &max,                /* initial and chosen value */
         upd.size(),          /* # of indices in upd */
         upd.indexMem(),      /* nonzero indices in upd */
         upd.values(),        /* update VectorBase<R> for vec */
         vec.get_const_ptr(),                 /* current VectorBase<R> */
         low.get_const_ptr(),                 /* lower bounds for vec */
         up.get_const_ptr()                   /* upper bounds for vec */
      );

      if(max == val)
         return -1;

      // phase 2:
      stab = 0;
      sel = R(infinity);
      useeps = maxabs * epsilon * 0.001;

      if(useeps < epsilon)
         useeps = epsilon;

      for(j = upd.size() - 1; j >= 0; --j)
      {
         i = upd.index(j);
         x = upd[i];

         if(x < -useeps)
         {
            y = up[i] - vec[i];

            if(y < -degeneps)
               this->solver()->shiftUBbound(i, vec[i]);   // ensure simplex improvement
            else
            {
               y /= x;

               if(y >= max && y < sel + epsilon && -x > stab)
               {
                  sel = y;
                  leave = i;
                  stab = -x;
               }
            }
         }
         else if(x > useeps)
         {
            y = low[i] - vec[i];

            if(y > degeneps)
               this->solver()->shiftLBbound(i, vec[i]); // ensure simplex improvement
            else
            {
               y /= x;

               if(y >= max && y < sel + epsilon && x > stab)
               {
                  sel = y;
                  leave = i;
                  stab = x;
               }
            }
         }
         else
            upd.clearNum(j);
      }
   }

   else
      return -1;


   if(lastshift != this->solver()->shift())
      return selectLeave(val, 0, false);

   assert(leave >= 0);

   val = sel;
   return leave;
}